

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::AssignFromValue::visitExpressions(AssignFromValue *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  uint in_EAX;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  Assignment::visitExpressions(&this->super_Assignment,fn);
  pEVar1 = (this->source).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  uStack_18 = (ulong)(uint)uStack_18;
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn,&this->source,(AccessType *)((long)&uStack_18 + 4));
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            Assignment::visitExpressions (fn);
            source->visitExpressions (fn, AccessType::read);
            fn (source, AccessType::read);
        }